

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

QRegion __thiscall
QHeaderView::visualRegionForSelection(QHeaderView *this,QItemSelection *selection)

{
  QHeaderViewPrivate *this_00;
  long lVar1;
  QItemSelectionRange *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_RDX;
  long lVar10;
  long lVar11;
  const_iterator __begin3;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  const_iterator __end3;
  QRect local_50;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHeaderViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
  iVar4 = QHeaderViewPrivate::modelSectionCount(this_00);
  this_01 = *(QItemSelectionRange **)(in_RDX + 8);
  lVar10 = *(long *)(in_RDX + 0x10);
  lVar11 = lVar10 * 0x10;
  pQVar2 = this_01 + lVar10;
  lVar1 = (this_00->visualIndices).d.size;
  if (this_00->orientation == Horizontal) {
    if (lVar1 == 0) {
      iVar8 = 0;
      for (lVar10 = lVar10 << 4; lVar10 != 0; lVar10 = lVar10 + -0x10) {
        QPersistentModelIndex::parent();
        if ((((local_50.x1.m_i < 0) || (local_50.y1.m_i < 0)) || (local_40 == 0)) &&
           (bVar3 = QItemSelectionRange::isValid(this_01), bVar3)) {
          iVar5 = QPersistentModelIndex::column();
          if (iVar5 < iVar4) {
            iVar4 = QPersistentModelIndex::column();
          }
          iVar5 = QPersistentModelIndex::column();
          if (iVar8 < iVar5) {
            iVar8 = QPersistentModelIndex::column();
          }
        }
        this_01 = this_01 + 1;
      }
    }
    else {
      iVar8 = 0;
      for (; this_01 != pQVar2; this_01 = this_01 + 1) {
        QPersistentModelIndex::parent();
        if ((((local_50.x1.m_i < 0) || (local_50.y1.m_i < 0)) || (local_40 == 0)) &&
           (bVar3 = QItemSelectionRange::isValid(this_01), bVar3)) {
          for (iVar5 = QPersistentModelIndex::column(); iVar6 = QPersistentModelIndex::column(),
              iVar5 <= iVar6; iVar5 = iVar5 + 1) {
            iVar7 = visualIndex((QHeaderView *)selection,iVar5);
            iVar6 = iVar4;
            if (iVar7 < iVar4) {
              iVar6 = iVar7;
            }
            iVar9 = iVar8;
            if (iVar8 < iVar7) {
              iVar9 = iVar7;
            }
            if (iVar7 != -1) {
              iVar4 = iVar6;
              iVar8 = iVar9;
            }
          }
        }
      }
      iVar4 = logicalIndex((QHeaderView *)selection,iVar4);
      iVar8 = logicalIndex((QHeaderView *)selection,iVar8);
    }
    if (((-1 < iVar4) && (iVar5 = count((QHeaderView *)selection), iVar4 < iVar5)) &&
       ((-1 < iVar8 && (iVar5 = count((QHeaderView *)selection), iVar8 < iVar5)))) {
      iVar4 = sectionViewportPosition((QHeaderView *)selection,iVar4);
      iVar5 = sectionViewportPosition((QHeaderView *)selection,iVar8);
      iVar8 = sectionSize((QHeaderView *)selection,iVar8);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_50.y2.m_i = *(int *)&pQVar2[2].tl.d - *(int *)&pQVar2[1].br.d;
      local_50.y1.m_i = 0;
      local_50.x2.m_i = iVar8 + iVar5 + -1;
      local_50.x1.m_i = iVar4;
LAB_004fcfef:
      QRegion::QRegion((QRegion *)this,&local_50,Rectangle);
      goto LAB_004fd00d;
    }
  }
  else {
    if (lVar1 == 0) {
      iVar8 = 0;
      for (; lVar11 != 0; lVar11 = lVar11 + -0x10) {
        QPersistentModelIndex::parent();
        if ((((local_50.x1.m_i < 0) || (local_50.y1.m_i < 0)) || (local_40 == 0)) &&
           (bVar3 = QItemSelectionRange::isValid(this_01), bVar3)) {
          iVar5 = QPersistentModelIndex::row();
          if (iVar5 < iVar4) {
            iVar4 = QPersistentModelIndex::row();
          }
          iVar5 = QPersistentModelIndex::row();
          if (iVar8 < iVar5) {
            iVar8 = QPersistentModelIndex::row();
          }
        }
        this_01 = this_01 + 1;
      }
    }
    else {
      iVar8 = 0;
      for (; this_01 != pQVar2; this_01 = this_01 + 1) {
        QPersistentModelIndex::parent();
        if ((((local_50.x1.m_i < 0) || (local_50.y1.m_i < 0)) || (local_40 == 0)) &&
           (bVar3 = QItemSelectionRange::isValid(this_01), bVar3)) {
          for (iVar5 = QPersistentModelIndex::row(); iVar6 = QPersistentModelIndex::row(),
              iVar5 <= iVar6; iVar5 = iVar5 + 1) {
            iVar7 = visualIndex((QHeaderView *)selection,iVar5);
            iVar6 = iVar4;
            if (iVar7 < iVar4) {
              iVar6 = iVar7;
            }
            iVar9 = iVar8;
            if (iVar8 < iVar7) {
              iVar9 = iVar7;
            }
            if (iVar7 != -1) {
              iVar8 = iVar9;
              iVar4 = iVar6;
            }
          }
        }
      }
      iVar4 = logicalIndex((QHeaderView *)selection,iVar4);
      iVar8 = logicalIndex((QHeaderView *)selection,iVar8);
    }
    if (((-1 < iVar4) && (iVar5 = count((QHeaderView *)selection), iVar4 < iVar5)) &&
       ((-1 < iVar8 && (iVar5 = count((QHeaderView *)selection), iVar8 < iVar5)))) {
      iVar4 = sectionViewportPosition((QHeaderView *)selection,iVar4);
      iVar5 = sectionViewportPosition((QHeaderView *)selection,iVar8);
      iVar8 = sectionSize((QHeaderView *)selection,iVar8);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_50.x2.m_i = *(int *)((long)&pQVar2[1].br.d + 4) - *(int *)((long)&pQVar2[1].tl.d + 4);
      local_50.x1.m_i = 0;
      local_50.y2.m_i = iVar8 + iVar5 + -1;
      local_50.y1.m_i = iVar4;
      goto LAB_004fcfef;
    }
  }
  QRegion::QRegion((QRegion *)this);
LAB_004fd00d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QHeaderView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QHeaderView);
    const int max = d->modelSectionCount();

    if (d->orientation == Qt::Horizontal) {
        int logicalLeft = max;
        int logicalRight = 0;

        if (d->visualIndices.empty()) {
            // If no reordered sections, skip redundant visual-to-logical transformations
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                if (r.left() < logicalLeft)
                    logicalLeft = r.left();
                if (r.right() > logicalRight)
                    logicalRight = r.right();
            }
        } else {
            int left = max;
            int right = 0;
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                for (int k = r.left(); k <= r.right(); ++k) {
                    int visual = visualIndex(k);
                    if (visual == -1)   // in some cases users may change the selections
                        continue;       // before we have a chance to do the layout
                    if (visual < left)
                        left = visual;
                    if (visual > right)
                        right = visual;
                }
            }
            logicalLeft = logicalIndex(left);
            logicalRight = logicalIndex(right);
        }

        if (logicalLeft < 0  || logicalLeft >= count() ||
            logicalRight < 0 || logicalRight >= count())
            return QRegion();

        int leftPos = sectionViewportPosition(logicalLeft);
        int rightPos = sectionViewportPosition(logicalRight);
        rightPos += sectionSize(logicalRight);
        return QRect(leftPos, 0, rightPos - leftPos, height());
    }
    // orientation() == Qt::Vertical
    int logicalTop = max;
    int logicalBottom = 0;

    if (d->visualIndices.empty()) {
        // If no reordered sections, skip redundant visual-to-logical transformations
        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            if (r.top() < logicalTop)
                logicalTop = r.top();
            if (r.bottom() > logicalBottom)
                logicalBottom = r.bottom();
        }
    } else {
        int top = max;
        int bottom = 0;

        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            for (int k = r.top(); k <= r.bottom(); ++k) {
                int visual = visualIndex(k);
                if (visual == -1)   // in some cases users may change the selections
                    continue;       // before we have a chance to do the layout
                if (visual < top)
                    top = visual;
                if (visual > bottom)
                    bottom = visual;
            }
        }

        logicalTop = logicalIndex(top);
        logicalBottom = logicalIndex(bottom);
    }

    if (logicalTop < 0 || logicalTop >= count() ||
        logicalBottom < 0 || logicalBottom >= count())
        return QRegion();

    int topPos = sectionViewportPosition(logicalTop);
    int bottomPos = sectionViewportPosition(logicalBottom) + sectionSize(logicalBottom);

    return QRect(0, topPos, width(), bottomPos - topPos);
}